

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long *plVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  TPZFNMatrix<100,_double> *this;
  long lVar14;
  int xj;
  ulong uVar15;
  long lVar16;
  int xj_2;
  uint uVar17;
  int (*local_fe0) [3];
  REAL outval;
  TPZVec<long> ids;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<80,_double> dphin;
  TPZFNMatrix<80,_double> phin;
  TPZFNMatrix<100,_double> dphiblend;
  TPZFNMatrix<100,_double> phiblend;
  
  CornerShape(pt,phi,dphi);
  bVar7 = true;
  for (lVar11 = 0; lVar11 != 0xb; lVar11 = lVar11 + 1) {
    bVar7 = (bool)(bVar7 & order->fStore[lVar11] < 2);
  }
  if (!bVar7) {
    TPZFNMatrix<100,_double>::TPZFNMatrix(&phiblend,0xf,1);
    this = &dphiblend;
    TPZFNMatrix<100,_double>::TPZFNMatrix(this,3,0xf);
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar1 = *pdVar9;
      this = &phiblend;
      pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar11,0);
      *pdVar9 = dVar1;
      for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar14,lVar11);
        dVar1 = *pdVar9;
        this = &dphiblend;
        pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar14,lVar11);
        *pdVar9 = dVar1;
      }
    }
    ShapeGenerating((TPZVec<double> *)this,&phiblend.super_TPZFMatrix<double>,
                    &dphiblend.super_TPZFMatrix<double>);
    lVar11 = 4;
    for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
      ProjectPoint3dTetraToRib((int)lVar14,pt,&outval);
      TPZVec<long>::TPZVec(&ids,2);
      TPZManVector<double,_1>::TPZManVector(&outvalvec,1,&outval);
      iVar10 = pztopology::TPZTetrahedron::SideNodes[lVar14][1];
      plVar5 = id->fStore;
      *ids.fStore = plVar5[pztopology::TPZTetrahedron::SideNodes[lVar14][0]];
      ids.fStore[1] = plVar5[iVar10];
      uVar13 = (long)order->fStore[lVar14] - 1;
      TPZFMatrix<double>::TPZFMatrix(&phin_1,uVar13,1,(double *)&dphin,0x14);
      TPZFMatrix<double>::TPZFMatrix(&dphin_1,3,uVar13,(double *)&phin,0x3c);
      memset(phin_1.fElem,0,
             phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      memset(dphin_1.fElem,0,
             dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             CONCAT44(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                      (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) * 8);
      dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      iVar10 = order->fStore[lVar14];
      iVar8 = TPZShapeLinear::GetTransformId1d(&ids);
      TPZShapeLinear::ShapeInternal(&outvalvec.super_TPZVec<double>,iVar10,&phin_1,&dphin_1,iVar8);
      TransformDerivativeFromRibToTetra((int)lVar14,(int)uVar13,&dphin_1);
      lVar12 = lVar14 + 4;
      lVar11 = (long)(int)lVar11;
      uVar15 = uVar13 & 0xffffffff;
      if ((int)uVar13 < 1) {
        uVar15 = 0;
      }
      for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
        dVar1 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar13,0);
        dVar2 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
        *pdVar9 = dVar1 * dVar2;
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar16,lVar12)
          ;
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar13,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
          dVar3 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,lVar16,uVar13);
          dVar4 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar16,lVar11);
          *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar11 = lVar11 + 1;
      }
      TPZFMatrix<double>::~TPZFMatrix(&dphin_1);
      TPZFMatrix<double>::~TPZFMatrix(&phin_1);
      TPZManVector<double,_1>::~TPZManVector(&outvalvec);
      TPZVec<long>::~TPZVec(&ids);
    }
    local_fe0 = pztopology::TPZTetrahedron::FaceNodes;
    lVar14 = 0;
    while( true ) {
      if (lVar14 == 4) break;
      if (2 < order->fStore[lVar14 + 6]) {
        TPZManVector<double,_2>::TPZManVector((TPZManVector<double,_2> *)&ids,2);
        ProjectPoint3dTetraToFace((int)lVar14,pt,(TPZVec<double> *)&ids);
        iVar10 = order->fStore[lVar14 + 6];
        if (2 < iVar10) {
          uVar17 = (uint)((iVar10 + -1) * (iVar10 + -2)) >> 1;
          uVar13 = (ulong)uVar17;
          TPZFMatrix<double>::TPZFMatrix(&phin_1,uVar13,1,(double *)&dphin,0x14);
          TPZFMatrix<double>::TPZFMatrix(&dphin_1,3,uVar13,(double *)&phin,0x3c);
          memset(phin_1.fElem,0,
                 phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          phin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          memset(dphin_1.fElem,0,
                 dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 CONCAT44(dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol._4_4_,
                          (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) * 8);
          dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)&outvalvec,3);
          lVar11 = (long)(int)lVar11;
          plVar5 = id->fStore;
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            outvalvec.super_TPZVec<double>.fStore[lVar12] = (double)plVar5[(*local_fe0)[lVar12]];
          }
          iVar8 = TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)&outvalvec);
          *ids.fStore = (long)(((double)*ids.fStore + 1.0) * 0.5);
          ids.fStore[1] = (long)(((double)ids.fStore[1] + 1.0) * 0.5);
          TPZShapeTriang::ShapeInternal((TPZVec<double> *)&ids,iVar10 + -2,&phin_1,&dphin_1,iVar8);
          uVar6 = (uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol;
          if ((int)(uint)dphin_1.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1) {
            uVar6 = 0;
          }
          for (uVar15 = 0; uVar6 != uVar15; uVar15 = uVar15 + 1) {
            pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,0,uVar15);
            *pdVar9 = *pdVar9 * 0.5;
            pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,1,uVar15);
            *pdVar9 = *pdVar9 * 0.5;
            pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,2,uVar15);
            *pdVar9 = *pdVar9 * 0.5;
          }
          TransformDerivativeFromFaceToTetra((int)lVar14,uVar17,&dphin_1);
          lVar12 = lVar14 + 10;
          for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
            pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
            dVar1 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar15,0);
            dVar2 = *pdVar9;
            pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
            *pdVar9 = dVar1 * dVar2;
            for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
              pdVar9 = TPZFMatrix<double>::operator()
                                 (&dphiblend.super_TPZFMatrix<double>,lVar16,lVar12);
              dVar1 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(&phin_1,uVar15,0);
              dVar2 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,lVar12,0);
              dVar3 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(&dphin_1,lVar16,uVar15);
              dVar4 = *pdVar9;
              pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar16,lVar11);
              *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
            }
            lVar11 = lVar11 + 1;
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&outvalvec);
          TPZFMatrix<double>::~TPZFMatrix(&dphin_1);
          TPZFMatrix<double>::~TPZFMatrix(&phin_1);
        }
        TPZManVector<double,_2>::~TPZManVector((TPZManVector<double,_2> *)&ids);
      }
      lVar14 = lVar14 + 1;
      local_fe0 = local_fe0 + 1;
    }
    if (3 < order->fStore[10]) {
      uVar17 = 0;
      iVar10 = 1;
      while ((3 - order->fStore[10]) + iVar10 != 1) {
        uVar17 = uVar17 + ((uint)(iVar10 * (iVar10 + 1)) >> 1);
        iVar10 = iVar10 + 1;
      }
      uVar13 = (ulong)uVar17;
      TPZFNMatrix<80,_double>::TPZFNMatrix(&phin,uVar13,1);
      TPZFNMatrix<80,_double>::TPZFNMatrix(&dphin,3,uVar13);
      memset(phin.super_TPZFMatrix<double>.fElem,0,
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      phin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      memset(dphin.super_TPZFMatrix<double>.fElem,0,
             dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      dphin.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      ShapeInternal(pt,order->fStore[10],&phin.super_TPZFMatrix<double>,
                    &dphin.super_TPZFMatrix<double>);
      lVar11 = (long)(int)lVar11;
      for (uVar15 = 0; uVar15 != uVar13; uVar15 = uVar15 + 1) {
        pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0xe,0);
        dVar1 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar15,0);
        dVar2 = *pdVar9;
        pdVar9 = TPZFMatrix<double>::operator()(phi,lVar11,0);
        *pdVar9 = dVar1 * dVar2;
        for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
          pdVar9 = TPZFMatrix<double>::operator()(&dphiblend.super_TPZFMatrix<double>,lVar14,0xe);
          dVar1 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phin.super_TPZFMatrix<double>,uVar15,0);
          dVar2 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&phiblend.super_TPZFMatrix<double>,0xe,0);
          dVar3 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(&dphin.super_TPZFMatrix<double>,lVar14,uVar15);
          dVar4 = *pdVar9;
          pdVar9 = TPZFMatrix<double>::operator()(dphi,lVar14,lVar11);
          *pdVar9 = dVar1 * dVar2 + dVar3 * dVar4;
        }
        lVar11 = lVar11 + 1;
      }
      TPZFNMatrix<80,_double>::~TPZFNMatrix(&dphin);
      TPZFNMatrix<80,_double>::~TPZFNMatrix(&phin);
    }
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&dphiblend);
    TPZFNMatrix<100,_double>::~TPZFNMatrix(&phiblend);
  }
  return;
}

Assistant:

void TPZShapeTetra::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		
		//  if(order[9]<2) return;
		int shape = 4;
		//rib shapes
		for (int rib = 0; rib < 6; rib++) {
			REAL outval;
			ProjectPoint3dTetraToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int ordin = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToTetra(rib,ordin,dphin);
			for (int i = 0; i < ordin; i++) {
				phi(shape,0) = phiblend(rib+4,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+4) * phin( i, 0) +
					phiblend(rib+4, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[10]<3) return;
		//face shapes
		for (int face = 0; face < 4; face++) {
			if (order[6+face] < 3) continue;
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dTetraToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			//elt->FaceOrder(face,ord1,ord2);
			ord1 = order[6+face];
			//ord2 = ord1;
			if(ord1<3) continue;
			int ordin =  (ord1-2)*(ord1-1)/2;
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(3);
			//	int id0,id1,id2;
			int i;
			for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//    id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			//    id2 = ShapeFaceId[face][2];
			int transid = TPZShapeTriang::GetTransformId2dT(ids);
			outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
			outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..)
			TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			int c = dphin.Cols();
			for(i=0;i<c;i++) {
				dphin(0,i) /= 2.;
				dphin(1,i) /= 2.;
				dphin(2,i) /= 2.;
			}
			TransformDerivativeFromFaceToTetra(face,ordin,dphin);//ord = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+10,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+10) * phin(i ,0) +
					phiblend(face+10, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[10]<4) return;
		//volume shapes
		int totsum = 0,sum;
		int i;
		for(i=0;i<order[10]-3;i++) {
			sum = (i+1)*(i+2) / 2;
			totsum += sum;
		}
		int ord = totsum;
		TPZFNMatrix<80> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[10],phin,dphin);
		for(i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}